

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O1

shared_ptr<minja::TemplateNode> __thiscall
minja::Parser::parseTemplate
          (Parser *this,TemplateTokenIterator *begin,TemplateTokenIterator *it,
          TemplateTokenIterator *end,bool fully)

{
  TemplateToken *pTVar1;
  unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *puVar2;
  unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> uVar3;
  element_type *peVar4;
  undefined8 uVar5;
  pointer pbVar6;
  undefined8 uVar7;
  int iVar8;
  long lVar9;
  pointer ppVar10;
  long lVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  Parser *pPVar13;
  runtime_error *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  char cVar14;
  undefined7 in_register_00000081;
  long *plVar16;
  undefined4 in_R9D;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  bool bVar17;
  bool bVar18;
  shared_ptr<minja::TemplateNode> sVar19;
  vector<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>_>_>
  cascade;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __result;
  vector<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
  children;
  undefined1 local_e8 [16];
  undefined1 local_d8 [32];
  undefined1 local_b8 [40];
  pointer local_90;
  undefined1 local_88 [32];
  vector<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
  local_68;
  undefined4 local_44;
  Parser *local_40;
  element_type *local_38;
  undefined1 *puVar15;
  
  local_44._0_1_ = (char)in_R9D;
  plVar16 = (long *)CONCAT71(in_register_00000081,fully);
  local_68.
  super__Vector_base<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40 = this;
  if (end->_M_current !=
      (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *)*plVar16) {
    local_38 = (element_type *)&PTR___Sp_counted_ptr_inplace_0026f6a8;
    local_90 = (pointer)it;
    local_88._24_8_ = begin;
    local_44 = in_R9D;
    do {
      local_d8._16_8_ = end->_M_current;
      puVar2 = (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *)
               (local_d8._16_8_ + 8);
      end->_M_current = puVar2;
      pTVar1 = (((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *)
                local_d8._16_8_)->_M_t).
               super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
               ._M_t.
               super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
               .super__Head_base<0UL,_minja::TemplateToken_*,_false>._M_head_impl;
      if (pTVar1 == (TemplateToken *)0x0) {
        lVar9 = 0;
      }
      else {
        lVar9 = __dynamic_cast(pTVar1,&TemplateToken::typeinfo,&IfTemplateToken::typeinfo,0);
      }
      begin = (TemplateTokenIterator *)local_88._24_8_;
      pbVar6 = local_90;
      if (lVar9 == 0) {
        if (pTVar1 == (TemplateToken *)0x0) {
          lVar9 = 0;
        }
        else {
          lVar9 = __dynamic_cast(pTVar1,&TemplateToken::typeinfo,&ForTemplateToken::typeinfo,0);
        }
        begin = (TemplateTokenIterator *)local_88._24_8_;
        pbVar6 = local_90;
        if (lVar9 != 0) {
          parseTemplate((Parser *)local_e8,(TemplateTokenIterator *)local_88._24_8_,
                        (TemplateTokenIterator *)local_90,end,fully);
          local_b8._0_8_ = (element_type *)0x0;
          local_b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          puVar2 = end->_M_current;
          if ((puVar2 != (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                          *)*plVar16) &&
             (((puVar2->_M_t).
               super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
               ._M_t.
               super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
               .super__Head_base<0UL,_minja::TemplateToken_*,_false>._M_head_impl)->type == Else)) {
            end->_M_current = puVar2 + 1;
            parseTemplate((Parser *)local_88,begin,(TemplateTokenIterator *)pbVar6,end,fully);
            uVar7 = local_88._8_8_;
            local_b8._0_8_ = local_88._0_8_;
            uVar5 = local_b8._8_8_;
            local_88._0_8_ = (element_type *)0x0;
            local_88._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_b8._8_8_ = uVar7;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5 !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
            }
          }
          puVar2 = end->_M_current;
          if ((puVar2 == (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                          *)*plVar16) ||
             (end->_M_current = puVar2 + 1,
             ((puVar2->_M_t).
              super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
              ._M_t.
              super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
              .super__Head_base<0UL,_minja::TemplateToken_*,_false>._M_head_impl)->type != EndFor))
          {
            pPVar13 = (Parser *)__cxa_allocate_exception(0x10);
            unterminated(pPVar13,(TemplateToken *)begin);
            __cxa_throw(pPVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          local_88._0_8_ = (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<minja::ForNode,std::allocator<minja::ForNode>,minja::Location&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::shared_ptr<minja::Expression>,std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>,bool&,std::shared_ptr<minja::TemplateNode>>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8),
                     (ForNode **)local_88,(allocator<minja::ForNode> *)(local_d8 + 0x1f),
                     (Location *)
                     ((long)*(__uniq_ptr_data<minja::TemplateToken,_std::default_delete<minja::TemplateToken>,_true,_true>
                              *)local_d8._16_8_ + 0x10),
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(lVar9 + 0x30),(shared_ptr<minja::Expression> *)(lVar9 + 0x48),
                     (shared_ptr<minja::Expression> *)(lVar9 + 0x58),
                     (shared_ptr<minja::TemplateNode> *)local_e8,(bool *)(lVar9 + 0x68),
                     (shared_ptr<minja::TemplateNode> *)local_b8);
          std::
          vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
          ::emplace_back<std::shared_ptr<minja::ForNode>>
                    ((vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
                      *)&local_68,(shared_ptr<minja::ForNode> *)local_88);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
          }
          goto LAB_001e6f89;
        }
        if (pTVar1 != (TemplateToken *)0x0) {
          lVar9 = __dynamic_cast(pTVar1,&TemplateToken::typeinfo,&GenerationTemplateToken::typeinfo,
                                 0);
          begin = (TemplateTokenIterator *)local_88._24_8_;
          if (lVar9 == 0) {
            if (pTVar1 == (TemplateToken *)0x0) goto LAB_001e7041;
            lVar9 = __dynamic_cast(pTVar1,&TemplateToken::typeinfo,&TextTemplateToken::typeinfo,0);
            goto LAB_001e7043;
          }
          parseTemplate((Parser *)local_e8,(TemplateTokenIterator *)local_88._24_8_,
                        (TemplateTokenIterator *)local_90,end,fully);
          puVar2 = end->_M_current;
          if ((puVar2 == (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                          *)*plVar16) ||
             (end->_M_current = puVar2 + 1,
             ((puVar2->_M_t).
              super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
              ._M_t.
              super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
              .super__Head_base<0UL,_minja::TemplateToken_*,_false>._M_head_impl)->type !=
             EndGeneration)) {
            pPVar13 = (Parser *)__cxa_allocate_exception(0x10);
            unterminated(pPVar13,(TemplateToken *)begin);
            __cxa_throw(pPVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          std::
          vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
          ::emplace_back<std::shared_ptr<minja::TemplateNode>>
                    ((vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
                      *)&local_68,(shared_ptr<minja::TemplateNode> *)local_e8);
          goto LAB_001e725c;
        }
LAB_001e7041:
        lVar9 = 0;
LAB_001e7043:
        if (lVar9 != 0) {
          if ((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *)
              (local_90->_M_dataplus)._M_p ==
              (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *)
              local_d8._16_8_) {
            bVar17 = false;
          }
          else {
            bVar17 = ((((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                         *)(local_d8._16_8_ - 8))->_M_t).
                      super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
                      .super__Head_base<0UL,_minja::TemplateToken_*,_false>._M_head_impl)->
                     post_space == Strip;
          }
          if (puVar2 == (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                         *)*plVar16) {
            bVar18 = false;
          }
          else {
            bVar18 = ((puVar2->_M_t).
                      super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
                      .super__Head_base<0UL,_minja::TemplateToken_*,_false>._M_head_impl)->pre_space
                     == Strip;
          }
          local_e8._0_8_ = local_d8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_e8,*(long *)(lVar9 + 0x30),
                     *(long *)(lVar9 + 0x38) + *(long *)(lVar9 + 0x30));
          begin = (TemplateTokenIterator *)local_88._24_8_;
          if (bVar18) {
            if ((parseTemplate(__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,bool)
                 ::trailing_space_regex_abi_cxx11_ == '\0') &&
               (iVar8 = __cxa_guard_acquire(&parseTemplate(__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,bool)
                                             ::trailing_space_regex_abi_cxx11_), iVar8 != 0)) {
              std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                        (&parseTemplate(__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,bool)
                          ::trailing_space_regex_abi_cxx11_,"\\s+$",0x10);
              __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                           ~basic_regex,
                           &parseTemplate(__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,bool)
                            ::trailing_space_regex_abi_cxx11_,&__dso_handle);
              __cxa_guard_release(&parseTemplate(__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,bool)
                                   ::trailing_space_regex_abi_cxx11_);
              begin = (TemplateTokenIterator *)local_88._24_8_;
            }
            local_b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_b8._16_8_ = local_b8._16_8_ & 0xffffffffffffff00;
            local_b8._0_8_ = (element_type *)(local_b8 + 0x10);
            std::
            __regex_replace<std::back_insert_iterator<std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::regex_traits<char>,char>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8
                       ,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )local_e8._0_8_,
                       (char *)(local_e8._0_8_ +
                               (long)(shared_ptr<minja::Expression> *)local_e8._8_8_),
                       &parseTemplate(__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,bool)
                        ::trailing_space_regex_abi_cxx11_,"",0,0);
            std::__cxx11::string::operator=((string *)local_e8,(string *)local_b8);
            if ((element_type *)local_b8._0_8_ != (element_type *)(local_b8 + 0x10)) {
              operator_delete((void *)local_b8._0_8_,(ulong)(local_b8._16_8_ + 1));
            }
          }
          else if ((*(byte *)(local_88._24_8_ + 0x29) == 1) &&
                  (puVar2 = end->_M_current,
                  puVar2 != (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                             *)*plVar16)) {
            bVar18 = (pointer)local_e8._8_8_ == (pointer)0x0;
            ppVar10 = (pointer)local_e8._8_8_;
            if (!bVar18) {
              do {
                if ((((char *)(local_e8._0_8_ + -1))[(long)ppVar10] != ' ') &&
                   (((char *)(local_e8._0_8_ + -1))[(long)ppVar10] != '\t')) {
                  if (!(bool)(bVar18 & puVar2 + -1 ==
                                       (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                        *)(local_90->_M_dataplus)._M_p)) goto LAB_001e71bb;
                  goto LAB_001e73e7;
                }
                ppVar10 = (pointer)((long)&ppVar10[-1].second.
                                           super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi + 7);
                bVar18 = ppVar10 == (pointer)0x0;
              } while (!bVar18);
              ppVar10 = (pointer)0x0;
            }
            if (puVar2 + -1 !=
                (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *)
                (local_90->_M_dataplus)._M_p) {
LAB_001e71bb:
              if ((bVar18) || (((char *)(local_e8._0_8_ + -1))[(long)ppVar10] != '\n'))
              goto LAB_001e73f3;
            }
LAB_001e73e7:
            std::__cxx11::string::resize((ulong)local_e8,(char)ppVar10);
          }
LAB_001e73f3:
          if (bVar17) {
            if ((parseTemplate(__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,bool)
                 ::leading_space_regex_abi_cxx11_ == '\0') &&
               (iVar8 = __cxa_guard_acquire(&parseTemplate(__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,bool)
                                             ::leading_space_regex_abi_cxx11_), iVar8 != 0)) {
              std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                        (&parseTemplate(__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,bool)
                          ::leading_space_regex_abi_cxx11_,"^\\s+",0x10);
              __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                           ~basic_regex,
                           &parseTemplate(__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,bool)
                            ::leading_space_regex_abi_cxx11_,&__dso_handle);
              __cxa_guard_release(&parseTemplate(__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,bool)
                                   ::leading_space_regex_abi_cxx11_);
              begin = (TemplateTokenIterator *)local_88._24_8_;
            }
            local_b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_b8._16_8_ = local_b8._16_8_ & 0xffffffffffffff00;
            local_b8._0_8_ = (element_type *)(local_b8 + 0x10);
            std::
            __regex_replace<std::back_insert_iterator<std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::regex_traits<char>,char>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8
                       ,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )local_e8._0_8_,
                       (char *)(local_e8._0_8_ +
                               (long)(shared_ptr<minja::Expression> *)local_e8._8_8_),
                       &parseTemplate(__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,bool)
                        ::leading_space_regex_abi_cxx11_,"",0,0);
            std::__cxx11::string::operator=((string *)local_e8,(string *)local_b8);
            if ((element_type *)local_b8._0_8_ != (element_type *)(local_b8 + 0x10)) {
              operator_delete((void *)local_b8._0_8_,(ulong)(local_b8._16_8_ + 1));
            }
          }
          else if (((((char)((TemplateToken *)begin)->pre_space == Strip) &&
                    (end->_M_current + -1 !=
                     (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *
                     )(local_90->_M_dataplus)._M_p)) &&
                   ((pTVar1 = end->_M_current[-2]._M_t.
                              super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
                              .super__Head_base<0UL,_minja::TemplateToken_*,_false>._M_head_impl,
                    pTVar1 == (TemplateToken *)0x0 ||
                    (lVar9 = __dynamic_cast(pTVar1,&TemplateToken::typeinfo,
                                            &ExpressionTemplateToken::typeinfo,0), lVar9 == 0)))) &&
                  (((pointer)local_e8._8_8_ != (pointer)0x0 && (*(char *)local_e8._0_8_ == '\n'))))
          {
            std::__cxx11::string::erase((ulong)local_e8,0);
          }
          if ((((end->_M_current ==
                 (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *)
                 *plVar16) && (*(byte *)((long)&((TemplateToken *)begin)->pre_space + 2) == 0)) &&
              ((pointer)local_e8._8_8_ != (pointer)0x0)) &&
             (((char *)(local_e8._0_8_ + -1))[local_e8._8_8_] == '\n')) {
            puVar15 = (undefined1 *)
                      ((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                              (local_e8._8_8_ + -0x10))->_M_weak_count + 3);
            if (puVar15 == (undefined1 *)0x0) {
              cVar14 = '\0';
            }
            else {
              if (((char *)(local_e8._0_8_ + -2))[local_e8._8_8_] == '\r') {
                puVar15 = (undefined1 *)
                          ((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                  (local_e8._8_8_ + -0x10))->_M_weak_count + 2);
              }
              cVar14 = (char)puVar15;
            }
            std::__cxx11::string::resize((ulong)local_e8,cVar14);
          }
          local_b8._0_8_ = (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<minja::TextNode,std::allocator<minja::TextNode>,minja::Location&,std::__cxx11::string&>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8),
                     (TextNode **)local_b8,(allocator<minja::TextNode> *)local_88,
                     (Location *)
                     ((long)*(__uniq_ptr_data<minja::TemplateToken,_std::default_delete<minja::TemplateToken>,_true,_true>
                              *)local_d8._16_8_ + 0x10),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8);
          std::
          vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
          ::emplace_back<std::shared_ptr<minja::TextNode>>
                    ((vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
                      *)&local_68,(shared_ptr<minja::TextNode> *)local_b8);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
          }
          if ((element_type *)local_e8._0_8_ != (element_type *)local_d8) {
            operator_delete((void *)local_e8._0_8_,(ulong)(local_d8._0_8_ + 1));
          }
          goto LAB_001e726b;
        }
        if (pTVar1 == (TemplateToken *)0x0) {
          lVar9 = 0;
        }
        else {
          lVar9 = __dynamic_cast(pTVar1,&TemplateToken::typeinfo,&ExpressionTemplateToken::typeinfo,
                                 0);
        }
        begin = (TemplateTokenIterator *)local_88._24_8_;
        if (lVar9 == 0) {
          if (pTVar1 == (TemplateToken *)0x0) {
            lVar9 = 0;
          }
          else {
            lVar9 = __dynamic_cast(pTVar1,&TemplateToken::typeinfo,&SetTemplateToken::typeinfo,0);
          }
          if (lVar9 == 0) {
            if (pTVar1 == (TemplateToken *)0x0) {
              lVar9 = 0;
            }
            else {
              lVar9 = __dynamic_cast(pTVar1,&TemplateToken::typeinfo,&MacroTemplateToken::typeinfo,0
                                    );
            }
            if (lVar9 != 0) {
              parseTemplate((Parser *)local_e8,begin,(TemplateTokenIterator *)local_90,end,fully);
              puVar2 = end->_M_current;
              if ((puVar2 == (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                              *)*plVar16) ||
                 (end->_M_current = puVar2 + 1,
                 ((puVar2->_M_t).
                  super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
                  .super__Head_base<0UL,_minja::TemplateToken_*,_false>._M_head_impl)->type !=
                 EndMacro)) {
                pPVar13 = (Parser *)__cxa_allocate_exception(0x10);
                unterminated(pPVar13,(TemplateToken *)begin);
                __cxa_throw(pPVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              local_b8._0_8_ = (element_type *)0x0;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<minja::MacroNode,std::allocator<minja::MacroNode>,minja::Location&,std::shared_ptr<minja::VariableExpr>,std::vector<std::pair<std::__cxx11::string,std::shared_ptr<minja::Expression>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<minja::Expression>>>>,std::shared_ptr<minja::TemplateNode>>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8),
                         (MacroNode **)local_b8,(allocator<minja::MacroNode> *)local_88,
                         (Location *)
                         ((long)*(__uniq_ptr_data<minja::TemplateToken,_std::default_delete<minja::TemplateToken>,_true,_true>
                                  *)local_d8._16_8_ + 0x10),
                         (shared_ptr<minja::VariableExpr> *)(lVar9 + 0x30),
                         (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
                          *)(lVar9 + 0x40),(shared_ptr<minja::TemplateNode> *)local_e8);
              std::
              vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
              ::emplace_back<std::shared_ptr<minja::MacroNode>>
                        ((vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
                          *)&local_68,(shared_ptr<minja::MacroNode> *)local_b8);
              goto LAB_001e6f89;
            }
            if (pTVar1 == (TemplateToken *)0x0) {
              lVar9 = 0;
            }
            else {
              lVar9 = __dynamic_cast(pTVar1,&TemplateToken::typeinfo,&FilterTemplateToken::typeinfo,
                                     0);
            }
            if (lVar9 == 0) {
              if (pTVar1 == (TemplateToken *)0x0) {
LAB_001e776a:
                lVar9 = 0;
              }
              else {
                lVar9 = __dynamic_cast(pTVar1,&TemplateToken::typeinfo,
                                       &CommentTemplateToken::typeinfo,0);
                if (lVar9 != 0) goto LAB_001e791e;
                if (pTVar1 == (TemplateToken *)0x0) goto LAB_001e776a;
                lVar9 = __dynamic_cast(pTVar1,&TemplateToken::typeinfo,
                                       &LoopControlTemplateToken::typeinfo,0);
              }
              if (lVar9 == 0) {
                if ((pTVar1 == (TemplateToken *)0x0) ||
                   ((lVar11 = __dynamic_cast(pTVar1,&TemplateToken::typeinfo,
                                             &EndForTemplateToken::typeinfo,0), lVar11 == 0 &&
                    ((pTVar1 == (TemplateToken *)0x0 ||
                     ((lVar11 = __dynamic_cast(pTVar1,&TemplateToken::typeinfo,
                                               &EndSetTemplateToken::typeinfo,0), lVar11 == 0 &&
                      ((pTVar1 == (TemplateToken *)0x0 ||
                       ((lVar11 = __dynamic_cast(pTVar1,&TemplateToken::typeinfo,
                                                 &EndMacroTemplateToken::typeinfo,0), lVar11 == 0 &&
                        ((pTVar1 == (TemplateToken *)0x0 ||
                         ((lVar11 = __dynamic_cast(pTVar1,&TemplateToken::typeinfo,
                                                   &EndFilterTemplateToken::typeinfo,0), lVar11 == 0
                          && ((pTVar1 == (TemplateToken *)0x0 ||
                              ((lVar11 = __dynamic_cast(pTVar1,&TemplateToken::typeinfo,
                                                        &EndIfTemplateToken::typeinfo,0),
                               lVar11 == 0 &&
                               ((pTVar1 == (TemplateToken *)0x0 ||
                                ((lVar11 = __dynamic_cast(pTVar1,&TemplateToken::typeinfo,
                                                          &ElseTemplateToken::typeinfo,0),
                                 lVar11 == 0 &&
                                 ((pTVar1 == (TemplateToken *)0x0 ||
                                  ((lVar11 = __dynamic_cast(pTVar1,&TemplateToken::typeinfo,
                                                            &EndGenerationTemplateToken::typeinfo,0)
                                   , lVar11 == 0 &&
                                   ((pTVar1 == (TemplateToken *)0x0 ||
                                    (lVar11 = __dynamic_cast(pTVar1,&TemplateToken::typeinfo,
                                                             &ElifTemplateToken::typeinfo,0),
                                    lVar11 == 0)))))))))))))))))))))))))))))) {
                  pPVar13 = (Parser *)__cxa_allocate_exception(0x10);
                  unexpected(pPVar13,(TemplateToken *)begin);
                  __cxa_throw(pPVar13,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                end->_M_current =
                     (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *
                     )local_d8._16_8_;
                iVar8 = 3;
              }
              else {
                local_e8._0_8_ = (element_type *)0x0;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                __shared_count<minja::LoopControlNode,std::allocator<minja::LoopControlNode>,minja::Location&,minja::LoopControlType&>
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 8),
                           (LoopControlNode **)local_e8,
                           (allocator<minja::LoopControlNode> *)local_b8,
                           (Location *)
                           ((long)*(__uniq_ptr_data<minja::TemplateToken,_std::default_delete<minja::TemplateToken>,_true,_true>
                                    *)local_d8._16_8_ + 0x10),(LoopControlType *)(lVar9 + 0x30));
                std::
                vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
                ::emplace_back<std::shared_ptr<minja::LoopControlNode>>
                          ((vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
                            *)&local_68,(shared_ptr<minja::LoopControlNode> *)local_e8);
                if ((pointer)local_e8._8_8_ != (pointer)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
                }
                iVar8 = 0;
              }
              if (lVar9 != 0) goto LAB_001e791e;
            }
            else {
              parseTemplate((Parser *)local_e8,begin,(TemplateTokenIterator *)local_90,end,fully);
              puVar2 = end->_M_current;
              if ((puVar2 == (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                              *)*plVar16) ||
                 (end->_M_current = puVar2 + 1,
                 ((puVar2->_M_t).
                  super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
                  .super__Head_base<0UL,_minja::TemplateToken_*,_false>._M_head_impl)->type !=
                 EndFilter)) {
                pPVar13 = (Parser *)__cxa_allocate_exception(0x10);
                unterminated(pPVar13,(TemplateToken *)begin);
                __cxa_throw(pPVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              std::
              make_shared<minja::FilterNode,minja::Location&,std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>
                        ((Location *)local_b8,
                         (shared_ptr<minja::Expression> *)
                         ((long)*(__uniq_ptr_data<minja::TemplateToken,_std::default_delete<minja::TemplateToken>,_true,_true>
                                  *)local_d8._16_8_ + 0x10),
                         (shared_ptr<minja::TemplateNode> *)(lVar9 + 0x30));
              std::
              vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
              ::emplace_back<std::shared_ptr<minja::FilterNode>>
                        ((vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
                          *)&local_68,(shared_ptr<minja::FilterNode> *)local_b8);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
              }
              if ((pointer)local_e8._8_8_ != (pointer)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
              }
LAB_001e791e:
              iVar8 = 0;
            }
            if (iVar8 == 0) goto LAB_001e726b;
            break;
          }
          if (*(long *)(lVar9 + 0x68) == 0) {
            parseTemplate((Parser *)local_e8,begin,(TemplateTokenIterator *)local_90,end,fully);
            puVar2 = end->_M_current;
            if ((puVar2 == (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                            *)*plVar16) ||
               (end->_M_current = puVar2 + 1,
               ((puVar2->_M_t).
                super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                ._M_t.
                super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
                .super__Head_base<0UL,_minja::TemplateToken_*,_false>._M_head_impl)->type != EndSet)
               ) {
              pPVar13 = (Parser *)__cxa_allocate_exception(0x10);
              unterminated(pPVar13,(TemplateToken *)begin);
              __cxa_throw(pPVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            if (*(long *)(lVar9 + 0x38) != 0) {
              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error
                        (this_00,"Namespaced set not supported in set with template value");
LAB_001e7d18:
              __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            if (*(long *)(lVar9 + 0x58) -
                (long)*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                       (lVar9 + 0x50) != 0x20) {
              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error
                        (this_00,"Structural assignment not supported in set with template value");
              goto LAB_001e7d18;
            }
            local_b8._0_8_ = (element_type *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<minja::SetTemplateNode,std::allocator<minja::SetTemplateNode>,minja::Location&,std::__cxx11::string&,std::shared_ptr<minja::TemplateNode>>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8),
                       (SetTemplateNode **)local_b8,(allocator<minja::SetTemplateNode> *)local_88,
                       (Location *)
                       ((long)*(__uniq_ptr_data<minja::TemplateToken,_std::default_delete<minja::TemplateToken>,_true,_true>
                                *)local_d8._16_8_ + 0x10),
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (lVar9 + 0x50),(shared_ptr<minja::TemplateNode> *)local_e8);
            std::
            vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
            ::emplace_back<std::shared_ptr<minja::SetTemplateNode>>
                      ((vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
                        *)&local_68,(shared_ptr<minja::SetTemplateNode> *)local_b8);
LAB_001e6f89:
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
            }
          }
          else {
            local_e8._0_8_ = (element_type *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<minja::SetNode,std::allocator<minja::SetNode>,minja::Location&,std::__cxx11::string&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::shared_ptr<minja::Expression>>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 8),
                       (SetNode **)local_e8,(allocator<minja::SetNode> *)local_b8,
                       (Location *)
                       ((long)*(__uniq_ptr_data<minja::TemplateToken,_std::default_delete<minja::TemplateToken>,_true,_true>
                                *)local_d8._16_8_ + 0x10),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (lVar9 + 0x30),
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(lVar9 + 0x50),(shared_ptr<minja::Expression> *)(lVar9 + 0x68));
            std::
            vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
            ::emplace_back<std::shared_ptr<minja::SetNode>>
                      ((vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
                        *)&local_68,(shared_ptr<minja::SetNode> *)local_e8);
          }
        }
        else {
          uVar3._M_t.
          super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>.
          _M_t.
          super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
          .super__Head_base<0UL,_minja::TemplateToken_*,_false>._M_head_impl =
               *(__uniq_ptr_data<minja::TemplateToken,_std::default_delete<minja::TemplateToken>,_true,_true>
                 *)local_d8._16_8_;
          local_e8._0_8_ = (element_type *)0x0;
          ppVar10 = (pointer)operator_new(0x40);
          (ppVar10->first).super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x100000001;
          (ppVar10->first).super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = local_38;
          ExpressionNode::ExpressionNode
                    ((ExpressionNode *)&ppVar10->second,
                     (Location *)
                     ((long)uVar3._M_t.
                            super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
                            .super__Head_base<0UL,_minja::TemplateToken_*,_false>._M_head_impl +
                     0x10),(shared_ptr<minja::Expression> *)(lVar9 + 0x30));
          local_e8._0_8_ = &ppVar10->second;
          local_e8._8_8_ = ppVar10;
          std::
          vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
          ::emplace_back<std::shared_ptr<minja::ExpressionNode>>
                    ((vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
                      *)&local_68,(shared_ptr<minja::ExpressionNode> *)local_e8);
        }
LAB_001e725c:
        if ((pointer)local_e8._8_8_ != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
        }
      }
      else {
        local_e8._0_8_ = (element_type *)0x0;
        local_e8._8_8_ = (pointer)0x0;
        local_d8._0_8_ = (pointer)0x0;
        parseTemplate((Parser *)local_b8,(TemplateTokenIterator *)local_88._24_8_,
                      (TemplateTokenIterator *)local_90,end,fully);
        std::
        vector<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>,std::allocator<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>>>
        ::emplace_back<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>
                  ((vector<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>,std::allocator<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>>>
                    *)local_e8,(shared_ptr<minja::Expression> *)(lVar9 + 0x30),
                   (shared_ptr<minja::TemplateNode> *)local_b8);
        while( true ) {
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
          }
          puVar2 = end->_M_current;
          if (puVar2 == (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                         *)*plVar16) goto LAB_001e6db9;
          if (((puVar2->_M_t).
               super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
               ._M_t.
               super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
               .super__Head_base<0UL,_minja::TemplateToken_*,_false>._M_head_impl)->type != Elif)
          break;
          end->_M_current = puVar2 + 1;
          pTVar1 = (puVar2->_M_t).
                   super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
                   .super__Head_base<0UL,_minja::TemplateToken_*,_false>._M_head_impl;
          if (pTVar1 == (TemplateToken *)0x0) {
            lVar9 = 0;
          }
          else {
            lVar9 = __dynamic_cast(pTVar1,&TemplateToken::typeinfo,&ElifTemplateToken::typeinfo,0);
          }
          parseTemplate((Parser *)local_b8,begin,(TemplateTokenIterator *)pbVar6,end,fully);
          std::
          vector<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>,std::allocator<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>>>
          ::emplace_back<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>
                    ((vector<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>,std::allocator<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>>>
                      *)local_e8,(shared_ptr<minja::Expression> *)(lVar9 + 0x30),
                     (shared_ptr<minja::TemplateNode> *)local_b8);
        }
        if ((puVar2 != (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                        *)*plVar16) &&
           (((puVar2->_M_t).
             super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
             ._M_t.
             super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
             .super__Head_base<0UL,_minja::TemplateToken_*,_false>._M_head_impl)->type == Else)) {
          local_88._0_8_ = (element_type *)0x0;
          end->_M_current = puVar2 + 1;
          parseTemplate((Parser *)local_b8,begin,(TemplateTokenIterator *)pbVar6,end,fully);
          std::
          vector<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>,std::allocator<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>>>
          ::emplace_back<decltype(nullptr),std::shared_ptr<minja::TemplateNode>>
                    ((vector<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>,std::allocator<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>>>
                      *)local_e8,(void **)local_88,(shared_ptr<minja::TemplateNode> *)local_b8);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
          }
        }
LAB_001e6db9:
        puVar2 = end->_M_current;
        if ((puVar2 == (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                        *)*plVar16) ||
           (end->_M_current = puVar2 + 1,
           ((puVar2->_M_t).
            super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>.
            _M_t.
            super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
            .super__Head_base<0UL,_minja::TemplateToken_*,_false>._M_head_impl)->type != EndIf)) {
          pPVar13 = (Parser *)__cxa_allocate_exception(0x10);
          unterminated(pPVar13,(TemplateToken *)begin);
          __cxa_throw(pPVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        local_b8._0_8_ = (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<minja::IfNode,std::allocator<minja::IfNode>,minja::Location&,std::vector<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>,std::allocator<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>>>>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8),(IfNode **)local_b8,
                   (allocator<minja::IfNode> *)local_88,
                   (Location *)
                   ((long)*(__uniq_ptr_data<minja::TemplateToken,_std::default_delete<minja::TemplateToken>,_true,_true>
                            *)local_d8._16_8_ + 0x10),
                   (vector<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>_>_>
                    *)local_e8);
        std::
        vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
        ::emplace_back<std::shared_ptr<minja::IfNode>>
                  ((vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
                    *)&local_68,(shared_ptr<minja::IfNode> *)local_b8);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
        }
        std::
        vector<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>_>_>
        ::~vector((vector<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>_>_>
                   *)local_e8);
      }
LAB_001e726b:
    } while (end->_M_current !=
             (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *)
             *plVar16);
  }
  pPVar13 = local_40;
  if (((char)local_44 != '\0') &&
     (end->_M_current !=
      (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *)*plVar16)) {
    pPVar13 = (Parser *)__cxa_allocate_exception(0x10);
    unexpected(pPVar13,(TemplateToken *)begin);
    __cxa_throw(pPVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_68.
      super__Vector_base<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_68.
      super__Vector_base<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_b8._0_8_ = ((TemplateToken *)begin)->_vptr_TemplateToken;
    local_b8._8_8_ = *(undefined8 *)&((TemplateToken *)begin)->type;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_)->_M_use_count + 1;
      }
    }
    local_b8._16_8_ = (char *)0x0;
    local_e8._8_8_ = (pointer)0x0;
    local_d8._0_8_ = local_d8._0_8_ & 0xffffffffffffff00;
    local_88._0_8_ = (element_type *)0x0;
    local_e8._0_8_ = (element_type *)local_d8;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<minja::TextNode,std::allocator<minja::TextNode>,minja::Location,std::__cxx11::string>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8),(TextNode **)local_88,
               (allocator<minja::TextNode> *)(local_d8 + 0x1f),(Location *)local_b8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8);
    uVar5 = local_88._8_8_;
    (pPVar13->template_str).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_88._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (pPVar13->template_str).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)local_88._0_8_;
    (pPVar13->template_str).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
    local_88._0_8_ = (element_type *)0x0;
    if ((element_type *)local_e8._0_8_ != (element_type *)local_d8) {
      operator_delete((void *)local_e8._0_8_,(ulong)(local_d8._0_8_ + 1));
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
    }
  }
  else {
    peVar4 = *(element_type **)
              local_68.
              super__Vector_base<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((long)local_68.
              super__Vector_base<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_68.
              super__Vector_base<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x10) {
      (local_40->template_str).
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = peVar4;
      (local_40->template_str).
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var12 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 ((long)local_68.
                        super__Vector_base<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + 8);
      *(long *)((long)local_68.
                      super__Vector_base<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 8) = 0;
      (local_40->template_str).
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = p_Var12;
      *(long *)local_68.
               super__Vector_base<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
               ._M_impl.super__Vector_impl_data._M_start = 0;
    }
    else {
      p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x48);
      p_Var12->_M_use_count = 1;
      p_Var12->_M_weak_count = 1;
      p_Var12->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0026fa18;
      SequenceNode::SequenceNode
                ((SequenceNode *)(p_Var12 + 1),(Location *)&peVar4->_M_string_length,&local_68);
      (pPVar13->template_str).
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)(p_Var12 + 1);
      (pPVar13->template_str).
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = p_Var12;
    }
  }
  std::
  vector<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
  ::~vector(&local_68);
  sVar19.super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar19.super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pPVar13;
  return (shared_ptr<minja::TemplateNode>)
         sVar19.super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<TemplateNode> parseTemplate(
          const TemplateTokenIterator & begin,
          TemplateTokenIterator & it,
          const TemplateTokenIterator & end,
          bool fully = false) const {
        std::vector<std::shared_ptr<TemplateNode>> children;
        while (it != end) {
          const auto start = it;
          const auto & token = *(it++);
          if (auto if_token = dynamic_cast<IfTemplateToken*>(token.get())) {
              std::vector<std::pair<std::shared_ptr<Expression>, std::shared_ptr<TemplateNode>>> cascade;
              cascade.emplace_back(std::move(if_token->condition), parseTemplate(begin, it, end));

              while (it != end && (*it)->type == TemplateToken::Type::Elif) {
                  auto elif_token = dynamic_cast<ElifTemplateToken*>((*(it++)).get());
                  cascade.emplace_back(std::move(elif_token->condition), parseTemplate(begin, it, end));
              }

              if (it != end && (*it)->type == TemplateToken::Type::Else) {
                cascade.emplace_back(nullptr, parseTemplate(begin, ++it, end));
              }
              if (it == end || (*(it++))->type != TemplateToken::Type::EndIf) {
                  throw unterminated(**start);
              }
              children.emplace_back(std::make_shared<IfNode>(token->location, std::move(cascade)));
          } else if (auto for_token = dynamic_cast<ForTemplateToken*>(token.get())) {
              auto body = parseTemplate(begin, it, end);
              auto else_body = std::shared_ptr<TemplateNode>();
              if (it != end && (*it)->type == TemplateToken::Type::Else) {
                else_body = parseTemplate(begin, ++it, end);
              }
              if (it == end || (*(it++))->type != TemplateToken::Type::EndFor) {
                  throw unterminated(**start);
              }
              children.emplace_back(std::make_shared<ForNode>(token->location, std::move(for_token->var_names), std::move(for_token->iterable), std::move(for_token->condition), std::move(body), for_token->recursive, std::move(else_body)));
          } else if (dynamic_cast<GenerationTemplateToken*>(token.get())) {
              auto body = parseTemplate(begin, it, end);
              if (it == end || (*(it++))->type != TemplateToken::Type::EndGeneration) {
                  throw unterminated(**start);
              }
              // Treat as a no-op, as our scope is templates for inference, not training (`{% generation %}` wraps generated tokens for masking).
              children.emplace_back(std::move(body));
          } else if (auto text_token = dynamic_cast<TextTemplateToken*>(token.get())) {
              SpaceHandling pre_space = (it - 1) != begin ? (*(it - 2))->post_space : SpaceHandling::Keep;
              SpaceHandling post_space = it != end ? (*it)->pre_space : SpaceHandling::Keep;

              auto text = text_token->text;
              if (post_space == SpaceHandling::Strip) {
                static std::regex trailing_space_regex(R"(\s+$)");
                text = std::regex_replace(text, trailing_space_regex, "");
              } else if (options.lstrip_blocks && it != end) {
                auto i = text.size();
                while (i > 0 && (text[i - 1] == ' ' || text[i - 1] == '\t')) i--;
                if ((i == 0 && (it - 1) == begin) || (i > 0 && text[i - 1] == '\n')) {
                  text.resize(i);
                }
              }
              if (pre_space == SpaceHandling::Strip) {
                static std::regex leading_space_regex(R"(^\s+)");
                text = std::regex_replace(text, leading_space_regex, "");
              } else if (options.trim_blocks && (it - 1) != begin && !dynamic_cast<ExpressionTemplateToken*>((*(it - 2)).get())) {
                if (!text.empty() && text[0] == '\n') {
                  text.erase(0, 1);
                }
              }
              if (it == end && !options.keep_trailing_newline) {
                auto i = text.size();
                if (i > 0 && text[i - 1] == '\n') {
                  i--;
                  if (i > 0 && text[i - 1] == '\r') i--;
                  text.resize(i);
                }
              }
              children.emplace_back(std::make_shared<TextNode>(token->location, text));
          } else if (auto expr_token = dynamic_cast<ExpressionTemplateToken*>(token.get())) {
              children.emplace_back(std::make_shared<ExpressionNode>(token->location, std::move(expr_token->expr)));
          } else if (auto set_token = dynamic_cast<SetTemplateToken*>(token.get())) {
            if (set_token->value) {
              children.emplace_back(std::make_shared<SetNode>(token->location, set_token->ns, set_token->var_names, std::move(set_token->value)));
            } else {
              auto value_template = parseTemplate(begin, it, end);
              if (it == end || (*(it++))->type != TemplateToken::Type::EndSet) {
                  throw unterminated(**start);
              }
              if (!set_token->ns.empty()) throw std::runtime_error("Namespaced set not supported in set with template value");
              if (set_token->var_names.size() != 1) throw std::runtime_error("Structural assignment not supported in set with template value");
              auto & name = set_token->var_names[0];
              children.emplace_back(std::make_shared<SetTemplateNode>(token->location, name, std::move(value_template)));
            }
          } else if (auto macro_token = dynamic_cast<MacroTemplateToken*>(token.get())) {
              auto body = parseTemplate(begin, it, end);
              if (it == end || (*(it++))->type != TemplateToken::Type::EndMacro) {
                  throw unterminated(**start);
              }
              children.emplace_back(std::make_shared<MacroNode>(token->location, std::move(macro_token->name), std::move(macro_token->params), std::move(body)));
          } else if (auto filter_token = dynamic_cast<FilterTemplateToken*>(token.get())) {
              auto body = parseTemplate(begin, it, end);
              if (it == end || (*(it++))->type != TemplateToken::Type::EndFilter) {
                  throw unterminated(**start);
              }
              children.emplace_back(std::make_shared<FilterNode>(token->location, std::move(filter_token->filter), std::move(body)));
          } else if (dynamic_cast<CommentTemplateToken*>(token.get())) {
              // Ignore comments
          } else if (auto ctrl_token = dynamic_cast<LoopControlTemplateToken*>(token.get())) {
              children.emplace_back(std::make_shared<LoopControlNode>(token->location, ctrl_token->control_type));
          } else if (dynamic_cast<EndForTemplateToken*>(token.get())
                  || dynamic_cast<EndSetTemplateToken*>(token.get())
                  || dynamic_cast<EndMacroTemplateToken*>(token.get())
                  || dynamic_cast<EndFilterTemplateToken*>(token.get())
                  || dynamic_cast<EndIfTemplateToken*>(token.get())
                  || dynamic_cast<ElseTemplateToken*>(token.get())
                  || dynamic_cast<EndGenerationTemplateToken*>(token.get())
                  || dynamic_cast<ElifTemplateToken*>(token.get())) {
              it--;  // unconsume the token
              break;  // exit the loop
          } else {
              throw unexpected(**(it-1));
          }
        }
        if (fully && it != end) {
            throw unexpected(**it);
        }
        if (children.empty()) {
          return std::make_shared<TextNode>(Location { template_str, 0 }, std::string());
        } else if (children.size() == 1) {
          return std::move(children[0]);
        } else {
          return std::make_shared<SequenceNode>(children[0]->location(), std::move(children));
        }
    }